

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::setProtocols(WindowImplX11 *this)

{
  bool bVar1;
  __pid_t _Var2;
  Atom AVar3;
  Atom AVar4;
  Atom AVar5;
  ostream *poVar6;
  long pid;
  undefined1 local_68 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> atoms;
  Atom netWmPing;
  Atom wmDeleteWindow;
  
  pid = (long)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pid,"WM_PROTOCOLS","");
  AVar3 = getAtom((string *)&pid,false);
  if ((undefined1 *)pid != local_68) {
    operator_delete((void *)pid);
  }
  pid = (long)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pid,"WM_DELETE_WINDOW","");
  wmDeleteWindow = getAtom((string *)&pid,false);
  if ((undefined1 *)pid != local_68) {
    operator_delete((void *)pid);
  }
  if (AVar3 == 0) {
    poVar6 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"Failed to request WM_PROTOCOLS atom.",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (wmDeleteWindow == 0) {
      poVar6 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Failed to request WM_DELETE_WINDOW atom.",0x28);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&atoms,(iterator)0x0,
                 &wmDeleteWindow);
    }
    netWmPing = 0;
    bVar1 = anon_unknown.dwarf_3f5874::WindowsImplX11Impl::ewmhSupported();
    if (bVar1) {
      pid = (long)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&pid,"_NET_WM_PING","");
      AVar4 = getAtom((string *)&pid,true);
      netWmPing = AVar4;
      if ((undefined1 *)pid != local_68) {
        operator_delete((void *)pid);
      }
      pid = (long)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&pid,"_NET_WM_PID","");
      AVar5 = getAtom((string *)&pid,true);
      if ((undefined1 *)pid != local_68) {
        operator_delete((void *)pid);
      }
      if (AVar5 != 0 && AVar4 != 0) {
        _Var2 = getpid();
        pid = (long)_Var2;
        XChangeProperty(this->m_display,this->m_window,AVar5,6,0x20,0,&pid,1);
        if (atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&atoms,
                     (iterator)
                     atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                     .super__Vector_impl_data._M_finish,&netWmPing);
        }
        else {
          *atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = AVar4;
          atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    if (atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar6 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Didn\'t set any window protocols",0x1f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      XChangeProperty(this->m_display,this->m_window,AVar3,4,0x20,0,
                      atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)atoms.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)atoms.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    if (atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void WindowImplX11::setProtocols()
{
    using namespace WindowsImplX11Impl;

    Atom wmProtocols = getAtom("WM_PROTOCOLS");
    Atom wmDeleteWindow = getAtom("WM_DELETE_WINDOW");

    if (!wmProtocols)
    {
        err() << "Failed to request WM_PROTOCOLS atom." << std::endl;
        return;
    }

    std::vector<Atom> atoms;

    if (wmDeleteWindow)
    {
        atoms.push_back(wmDeleteWindow);
    }
    else
    {
        err() << "Failed to request WM_DELETE_WINDOW atom." << std::endl;
    }

    Atom netWmPing = None;
    Atom netWmPid = None;

    if (ewmhSupported())
    {
        netWmPing = getAtom("_NET_WM_PING", true);
        netWmPid = getAtom("_NET_WM_PID", true);
    }

    if (netWmPing && netWmPid)
    {
        const long pid = getpid();

        XChangeProperty(m_display,
                        m_window,
                        netWmPid,
                        XA_CARDINAL,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&pid),
                        1);

        atoms.push_back(netWmPing);
    }

    if (!atoms.empty())
    {
        XChangeProperty(m_display,
                        m_window,
                        wmProtocols,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&atoms[0]),
                        static_cast<int>(atoms.size()));
    }
    else
    {
        err() << "Didn't set any window protocols" << std::endl;
    }
}